

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool match_ssl_primary_config(Curl_easy *data,ssl_primary_config *c1,ssl_primary_config *c2)

{
  _Bool _Var1;
  int iVar2;
  
  if (((((((*(uchar *)&(data->msg).list._prev == c1->version) &&
          (*(uint *)((long)&(data->msg).list._ptr + 4) == c1->version_max)) &&
         (*(uchar *)&(data->msg).list._ptr == c1->ssl_options)) &&
        ((((c1->field_0x79 ^ *(byte *)((long)&(data->msg).list._prev + 1)) & 7) == 0 &&
         (_Var1 = blobcmp((curl_blob *)(data->conn_queue)._list,c1->cert_blob), _Var1)))) &&
       ((_Var1 = blobcmp((curl_blob *)(data->conn_queue)._ptr,c1->ca_info_blob), _Var1 &&
        ((_Var1 = blobcmp((curl_blob *)(data->conn_queue)._prev,c1->issuercert_blob), _Var1 &&
         (_Var1 = Curl_safecmp(*(char **)data,c1->CApath), _Var1)))))) &&
      (_Var1 = Curl_safecmp((char *)data->id,c1->CAfile), _Var1)) &&
     (((((_Var1 = Curl_safecmp((char *)data->mid,c1->issuercert), _Var1 &&
         (_Var1 = Curl_safecmp((char *)data->conn,c1->clientcert), _Var1)) &&
        (iVar2 = Curl_timestrcmp((char *)(data->conn_queue)._next,c1->username), iVar2 == 0)) &&
       (((iVar2 = Curl_timestrcmp(*(char **)&data->mstate,c1->password), iVar2 == 0 &&
         (iVar2 = curl_strequal((char *)(data->multi_queue)._list,c1->cipher_list), iVar2 != 0)) &&
        ((iVar2 = curl_strequal((char *)(data->multi_queue)._ptr,c1->cipher_list13), iVar2 != 0 &&
         ((iVar2 = curl_strequal((char *)(data->msg).list._list,c1->curves), iVar2 != 0 &&
          (iVar2 = curl_strequal((char *)(data->multi_queue)._next,c1->CRLfile), iVar2 != 0))))))))
      && (iVar2 = curl_strequal((char *)(data->multi_queue)._prev,c1->pinned_key), iVar2 != 0)))) {
    return true;
  }
  return false;
}

Assistant:

static bool
match_ssl_primary_config(struct Curl_easy *data,
                         struct ssl_primary_config *c1,
                         struct ssl_primary_config *c2)
{
  (void)data;
  if((c1->version == c2->version) &&
     (c1->version_max == c2->version_max) &&
     (c1->ssl_options == c2->ssl_options) &&
     (c1->verifypeer == c2->verifypeer) &&
     (c1->verifyhost == c2->verifyhost) &&
     (c1->verifystatus == c2->verifystatus) &&
     blobcmp(c1->cert_blob, c2->cert_blob) &&
     blobcmp(c1->ca_info_blob, c2->ca_info_blob) &&
     blobcmp(c1->issuercert_blob, c2->issuercert_blob) &&
     Curl_safecmp(c1->CApath, c2->CApath) &&
     Curl_safecmp(c1->CAfile, c2->CAfile) &&
     Curl_safecmp(c1->issuercert, c2->issuercert) &&
     Curl_safecmp(c1->clientcert, c2->clientcert) &&
#ifdef USE_TLS_SRP
     !Curl_timestrcmp(c1->username, c2->username) &&
     !Curl_timestrcmp(c1->password, c2->password) &&
#endif
     strcasecompare(c1->cipher_list, c2->cipher_list) &&
     strcasecompare(c1->cipher_list13, c2->cipher_list13) &&
     strcasecompare(c1->curves, c2->curves) &&
     strcasecompare(c1->CRLfile, c2->CRLfile) &&
     strcasecompare(c1->pinned_key, c2->pinned_key))
    return TRUE;

  return FALSE;
}